

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topic_manager.cpp
# Opt level: O0

void __thiscall
miniros::TopicManager::getBusInfoCallback
          (TopicManager *this,XmlRpcValue *params,XmlRpcValue *result)

{
  string *in_RDI;
  XmlRpcValue response;
  int in_stack_ffffffffffffff5c;
  XmlRpcValue *in_stack_ffffffffffffff60;
  XmlRpcValue *this_00;
  int *in_stack_ffffffffffffff88;
  anon_union_8_8_d5adaace_for__value in_stack_ffffffffffffff90;
  XmlRpcValue *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  undefined1 local_51 [41];
  XmlRpcValue *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar1;
  
  uVar1 = 1;
  XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  XmlRpc::XmlRpcValue::operator=
            ((XmlRpcValue *)in_stack_ffffffffffffff90.asTime,in_stack_ffffffffffffff88);
  this_00 = (XmlRpcValue *)local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
             (allocator<char> *)in_stack_ffffffffffffff90.asTime);
  XmlRpc::XmlRpcValue::XmlRpcValue(this_00,in_RDI);
  XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98)
  ;
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4fc582);
  std::__cxx11::string::~string((string *)(local_51 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_51);
  XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&stack0xffffffffffffff88);
  getBusInfo((TopicManager *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
  XmlRpc::XmlRpcValue::operator[](in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98)
  ;
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x4fc5ea);
  return;
}

Assistant:

void TopicManager::getBusInfoCallback(const XmlRpc::XmlRpcValue& params, XmlRpc::XmlRpcValue& result)
{
  (void)params;
  result[0] = 1;
  result[1] = std::string("");
  XmlRpcValue response;
  getBusInfo(response);
  result[2] = response;
}